

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O1

void model_skip_for_sb_y_large
               (AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,MACROBLOCK *x,MACROBLOCKD *xd,
               RD_STATS *rd_stats,int *early_term,int calculate_rd,int64_t best_sse,uint *var_output
               ,uint var_prune_threshold)

{
  PREDICTION_MODE PVar1;
  INTER_SEARCH_EARLY_TERM_IDX IVar2;
  MB_MODE_INFO *pMVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint *var_tx;
  byte bVar10;
  int_interpfilters *piVar11;
  int iVar12;
  uint uVar13;
  uint8_t *puVar14;
  uint32_t *puVar15;
  uint32_t *puVar16;
  long lVar17;
  uint8_t *puVar18;
  int iVar19;
  int iVar20;
  AV1_COMP *cpi_00;
  long lVar21;
  int *piVar22;
  BLOCK_SIZE bsize_00;
  uint uVar23;
  uint *sse_tx;
  long lVar24;
  long lVar25;
  AV1_COMP *cpi_01;
  long lVar26;
  uint in_stack_fffffffffffff138;
  uint sse;
  int sum;
  int *local_eb8;
  ulong local_eb0;
  ulong local_ea8;
  ulong local_ea0;
  uint8_t *local_e98;
  uint8_t *local_e90;
  int local_e88;
  int local_e84;
  ulong local_e80;
  MACROBLOCKD *local_e78;
  AV1_COMP *local_e70;
  AV1_COMP *local_e68;
  long local_e60;
  long local_e58;
  ulong local_e50;
  ulong local_e48;
  long local_e40;
  int sum_1;
  uint var16x16 [64];
  uint var8x8 [256];
  uint sse8x8 [256];
  int sum8x8 [256];
  
  if (x->force_zeromv_skip_for_blk != 0) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    return;
  }
  local_e88 = mi_row;
  local_e84 = mi_col;
  local_e78 = xd;
  local_e70 = (AV1_COMP *)x;
  local_e68 = cpi;
  if ((bsize < BLOCK_32X64) || ((x->txfm_search_params).tx_mode_search_type == '\0')) {
    local_eb8 = (int *)(ulong)bsize;
    bVar10 = *(byte *)(local_eb8 + 0x142164);
    bVar6 = *(byte *)(local_eb8 + 0x142168);
    memset(sse8x8,0,0x400);
    memset(sum8x8,0,0x400);
    memset(var8x8,0,0x400);
    local_e90 = x->plane[0].src.buf;
    iVar12 = x->plane[0].src.stride;
    local_e98 = xd->plane[0].dst.buf;
    iVar19 = 4 << (bVar10 & 0x1f);
    uVar7 = 4 << (bVar6 & 0x1f);
    local_ea8 = 0;
    lVar21 = (long)xd->plane[0].dst.stride;
    sse = 0;
    sum = 0;
    local_eb0 = (ulong)bVar10;
    local_e80 = (ulong)bVar6;
    if (0 < (int)uVar7) {
      local_e50 = (ulong)uVar7;
      local_e58 = lVar21 * 8;
      local_e60 = (long)iVar12 * 8;
      uVar9 = 0;
      local_ea0 = CONCAT44(local_ea0._4_4_,iVar19);
      local_e40 = lVar21;
      do {
        local_e48 = uVar9;
        if (0 < iVar19) {
          iVar19 = (int)local_ea8;
          puVar16 = var8x8 + iVar19;
          piVar22 = sum8x8 + iVar19;
          puVar15 = sse8x8 + iVar19;
          lVar26 = 0;
          do {
            (*aom_get_var_sse_sum_8x8_quad)
                      (local_e90 + lVar26,iVar12,local_e98 + lVar26,(int)lVar21,puVar15,piVar22,&sse
                       ,&sum,puVar16);
            lVar26 = lVar26 + 0x20;
            local_ea8 = (ulong)((int)local_ea8 + 4);
            puVar16 = puVar16 + 4;
            piVar22 = piVar22 + 4;
            puVar15 = puVar15 + 4;
            lVar21 = local_e40;
            iVar19 = (int)local_ea0;
          } while ((int)lVar26 < (int)local_ea0);
        }
        uVar9 = local_e48 + 8;
        local_e98 = local_e98 + local_e58;
        local_e90 = local_e90 + local_e60;
      } while (uVar9 < local_e50);
    }
    cpi_01 = local_e68;
    cpi_00 = local_e70;
    local_e90 = (uint8_t *)(long)sum;
    cVar4 = (char)local_e80 + (char)local_eb0;
    local_ea8 = (ulong)sse;
    uVar7 = sse - (int)((ulong)((long)local_e90 * (long)local_e90) >> (cVar4 + 4U & 0x3f));
    local_e98 = (uint8_t *)(ulong)uVar7;
    if ((var_output != (uint *)0x0) && (*var_output = uVar7, var_prune_threshold < uVar7)) {
      return;
    }
    rd_stats->sse = local_ea8;
    *early_term = 0;
    bVar6 = calculate_tx_size(local_e68,(BLOCK_SIZE)local_eb8,(MACROBLOCK *)local_e70,uVar7,sse,
                              early_term);
    bVar10 = 1;
    if (1 < bVar6) {
      bVar10 = bVar6;
    }
    pMVar3 = *local_e78->mi;
    pMVar3->tx_size = bVar10;
    if (calculate_rd == 0) {
      IVar2 = (cpi_01->sf).rt_sf.sse_early_term_inter_search;
      if ((long)(int)IVar2 == 0) goto LAB_002263a3;
      if ((IVar2 == EARLY_TERM_IDX_4) &&
         ((PVar1 = pMVar3->mode, PVar1 == '\x10' || (PVar1 == '\r')))) {
        piVar11 = (int_interpfilters *)
                  (early_term_inter_search_with_sse_early_term_thresh_newmv_nearestmv +
                  (ulong)*(byte *)(local_eb8 + 0x142210) * 8);
      }
      else {
        piVar11 = filters_ref_set +
                  (ulong)*(byte *)(local_eb8 + 0x142210) * 2 + (long)(int)IVar2 * 8 + 4;
      }
      if (((int)IVar2 < 1) ||
         (bVar5 = true, (double)(long)local_ea8 * *(double *)piVar11 <= (double)best_sse))
      goto LAB_002263a3;
    }
    else {
LAB_002263a3:
      bVar5 = false;
    }
    if ((!bVar5) && (*early_term == 0)) {
      memset(&sum_1,0,0x100);
      memset(var16x16,0,0x100);
      uVar7 = 1 << (cVar4 - 2U & 0x1f);
      uVar9 = (ulong)uVar7;
      if (bVar6 < 2) {
        sse_tx = sse8x8;
        var_tx = var8x8;
      }
      else {
        iVar12 = (int)local_e80 + -1;
        if (iVar12 != 0x1f) {
          uVar13 = (int)local_eb0 - 1;
          local_eb0 = (ulong)uVar13;
          bVar10 = (byte)uVar13;
          iVar19 = 0;
          uVar23 = 0;
          do {
            if (uVar13 != 0x1f) {
              lVar25 = (long)iVar19;
              lVar21 = (long)(int)(uVar23 << (bVar10 & 0x1f));
              lVar24 = (long)(int)((uVar23 | 1) << (bVar10 & 0x1f));
              lVar26 = 0;
              do {
                iVar20 = sse8x8[lVar21 + lVar26 + 1] + sse8x8[lVar21 + lVar26] +
                         sse8x8[lVar24 + lVar26] + sse8x8[lVar24 + lVar26 + 1];
                *(int *)((long)&sum_1 + lVar26 * 2 + lVar25 * 4) = iVar20;
                lVar17 = (long)sum8x8[lVar24 + lVar26 + 1] + (long)sum8x8[lVar24 + lVar26] +
                         (long)sum8x8[lVar21 + lVar26 + 1] + (long)sum8x8[lVar21 + lVar26];
                *(int *)((long)var16x16 + lVar26 * 2 + lVar25 * 4) =
                     iVar20 - (int)((ulong)(lVar17 * lVar17) >> 8);
                lVar26 = lVar26 + 2;
                iVar19 = iVar19 + 1;
              } while (lVar26 < 1 << (bVar10 & 0x1f));
            }
            uVar23 = uVar23 + 2;
          } while ((int)uVar23 < 1 << ((byte)iVar12 & 0x1f));
        }
        uVar7 = uVar7 >> 2;
        sse_tx = (uint *)&sum_1;
        var_tx = var16x16;
        cpi_01 = local_e68;
        cpi_00 = local_e70;
        local_ea0 = uVar9;
      }
      set_early_term_based_on_uv_plane
                (cpi_01,(MACROBLOCK *)cpi_00,(BLOCK_SIZE)local_eb8,local_e78,local_e88,local_e84,
                 early_term,uVar7,sse_tx,var_tx,(int)local_e90,(uint)local_e98,(uint)local_ea8);
    }
    bsize_00 = (BLOCK_SIZE)sse;
    piVar22 = local_eb8;
    goto LAB_00226630;
  }
  (*xd->mi)->tx_size = '\x02';
  local_e80 = (ulong)bsize;
  bVar10 = ""[local_e80];
  bVar6 = ""[local_e80];
  uVar9 = 0;
  memset(sse8x8,0,0x100);
  memset(sum8x8,0,0x100);
  puVar14 = x->plane[0].src.buf;
  lVar21 = (long)x->plane[0].src.stride;
  puVar18 = xd->plane[0].dst.buf;
  local_eb8 = (int *)CONCAT44(local_eb8._4_4_,(uint)bVar10);
  iVar19 = 4 << (bVar10 & 0x1f);
  uVar7 = 4 << (bVar6 & 0x1f);
  iVar12 = xd->plane[0].dst.stride;
  var8x8[0] = 0;
  sum_1 = 0;
  local_eb0 = (ulong)bVar6;
  if (0 < (int)uVar7) {
    local_e50 = (ulong)uVar7;
    local_e58 = (long)iVar12 << 4;
    local_e60 = lVar21 << 4;
    uVar8 = 0;
    local_ea0 = CONCAT44(local_ea0._4_4_,iVar19);
    local_e40 = lVar21;
    do {
      local_e48 = uVar8;
      if (0 < iVar19) {
        puVar16 = (uint32_t *)(sum8x8 + (int)uVar9);
        puVar15 = sse8x8 + (int)uVar9;
        lVar21 = 0;
        local_e98 = puVar18;
        local_e90 = puVar14;
        do {
          local_ea8 = uVar9;
          (*aom_get_var_sse_sum_16x16_dual)
                    (local_e90 + lVar21,(int)local_e40,local_e98 + lVar21,iVar12,puVar15,var8x8,
                     &sum_1,puVar16);
          lVar21 = lVar21 + 0x20;
          uVar9 = (ulong)((int)local_ea8 + 2);
          puVar16 = puVar16 + 2;
          puVar15 = puVar15 + 2;
          puVar14 = local_e90;
          puVar18 = local_e98;
          iVar19 = (int)local_ea0;
        } while ((int)lVar21 < (int)local_ea0);
      }
      uVar8 = local_e48 + 0x10;
      puVar18 = puVar18 + local_e58;
      puVar14 = puVar14 + local_e60;
    } while (uVar8 < local_e50);
  }
  cpi_00 = local_e70;
  uVar9 = local_e80;
  cVar4 = (char)local_eb0 + (char)local_eb8;
  uVar7 = var8x8[0] - (int)((ulong)((long)sum_1 * (long)sum_1) >> (cVar4 + 4U & 0x3f));
  if ((var_output != (uint *)0x0) && (*var_output = uVar7, var_prune_threshold < uVar7)) {
    return;
  }
  rd_stats->sse = (ulong)var8x8[0];
  *early_term = 0;
  if (((((*(char *)((long)((local_e70->td).mb.coeff_costs.coeff_costs[2][0].lps_cost + 6) + 0x40) ==
          '\x02') && (1 < (local_e68->sf).rt_sf.tx_size_level_based_on_qstep)) &&
       (iVar12 = (int)*(short *)(*(long *)(local_e70->enc_quant_dequant_params).quants.y_quant[7] +
                                2) >>
                 ((char)(local_e70->enc_quant_dequant_params).quants.y_zbin[0xb3][0] - 5U & 0x1f),
       uVar13 = iVar12 * iVar12, var8x8[0] < uVar13)) &&
      (((uint)(local_e70->td).mb.coeff_costs.coeff_costs[2][1].base_cost[0xf][0] < uVar13 &&
       (*(char *)((long)((local_e70->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 6) ==
        '\0')))) &&
     (*(char *)((long)((local_e70->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 7) ==
      '\0')) {
    *early_term = 1;
  }
  if (calculate_rd == 0) {
    IVar2 = (local_e68->sf).rt_sf.sse_early_term_inter_search;
    if ((long)(int)IVar2 == 0) goto LAB_002260c1;
    if ((IVar2 == EARLY_TERM_IDX_4) &&
       ((PVar1 = (*local_e78->mi)->mode, PVar1 == '\x10' || (PVar1 == '\r')))) {
      piVar11 = (int_interpfilters *)
                (early_term_inter_search_with_sse_early_term_thresh_newmv_nearestmv +
                (ulong)""[local_e80] * 8);
    }
    else {
      piVar11 = filters_ref_set + (ulong)""[local_e80] * 2 + (long)(int)IVar2 * 8 + 4;
    }
    if (((int)IVar2 < 1) ||
       (bVar5 = true, (double)var8x8[0] * *(double *)piVar11 <= (double)best_sse))
    goto LAB_002260c1;
  }
  else {
LAB_002260c1:
    bVar5 = false;
  }
  if ((!bVar5) && (*early_term == 0)) {
    set_early_term_based_on_uv_plane
              (local_e68,(MACROBLOCK *)local_e70,(BLOCK_SIZE)local_e80,local_e78,local_e88,local_e84
               ,early_term,(1 << (cVar4 - 2U & 0x1f)) >> 2,sse8x8,(uint *)sum8x8,sum_1,uVar7,
               var8x8[0]);
  }
  bsize_00 = (BLOCK_SIZE)var8x8[0];
  piVar22 = (int *)(uVar9 & 0xffffffff);
LAB_00226630:
  calc_rate_dist_block_param
            (cpi_00,(MACROBLOCK *)rd_stats,(RD_STATS *)(ulong)(uint)calculate_rd,(int)early_term,
             piVar22,bsize_00,in_stack_fffffffffffff138);
  return;
}

Assistant:

static void model_skip_for_sb_y_large(AV1_COMP *cpi, BLOCK_SIZE bsize,
                                      int mi_row, int mi_col, MACROBLOCK *x,
                                      MACROBLOCKD *xd, RD_STATS *rd_stats,
                                      int *early_term, int calculate_rd,
                                      int64_t best_sse,
                                      unsigned int *var_output,
                                      unsigned int var_prune_threshold) {
  if (x->force_zeromv_skip_for_blk) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    return;
  }

  // For block sizes greater than 32x32, the transform size is always 16x16.
  // This function avoids calling calculate_variance() for tx_size 16x16 cases
  // by directly populating variance at tx_size level from
  // block_variance_16x16_dual() function.
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  if (CAP_TX_SIZE_FOR_BSIZE_GT32(txfm_params->tx_mode_search_type, bsize)) {
    xd->mi[0]->tx_size = TX_SIZE_FOR_BSIZE_GT32;
    model_skip_for_sb_y_large_64(cpi, bsize, mi_row, mi_col, x, xd, rd_stats,
                                 early_term, calculate_rd, best_sse, var_output,
                                 var_prune_threshold);
    return;
  }

  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  unsigned int sse;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  int test_skip = 1;
  unsigned int var;
  int sum;

  const int bw = b_width_log2_lookup[bsize];
  const int bh = b_height_log2_lookup[bsize];
  unsigned int sse8x8[256] = { 0 };
  int sum8x8[256] = { 0 };
  unsigned int var8x8[256] = { 0 };
  TX_SIZE tx_size;

  // Calculate variance for whole partition, and also save 8x8 blocks' variance
  // to be used in following transform skipping test.
  block_variance(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride,
                 4 << bw, 4 << bh, &sse, &sum, 8, sse8x8, sum8x8, var8x8);
  var = sse - (unsigned int)(((int64_t)sum * sum) >> (bw + bh + 4));
  if (var_output) {
    *var_output = var;
    if (*var_output > var_prune_threshold) {
      return;
    }
  }

  rd_stats->sse = sse;
  // Skipping test
  *early_term = 0;
  tx_size = calculate_tx_size(cpi, bsize, x, var, sse, early_term);
  assert(tx_size <= TX_16X16);
  // The code below for setting skip flag assumes transform size of at least
  // 8x8, so force this lower limit on transform.
  if (tx_size < TX_8X8) tx_size = TX_8X8;
  xd->mi[0]->tx_size = tx_size;

  MB_MODE_INFO *const mi = xd->mi[0];
  if (!calculate_rd && cpi->sf.rt_sf.sse_early_term_inter_search &&
      early_term_inter_search_with_sse(
          cpi->sf.rt_sf.sse_early_term_inter_search, bsize, sse, best_sse,
          mi->mode))
    test_skip = 0;

  if (*early_term) test_skip = 0;

  // Evaluate if the partition block is a skippable block in Y plane.
  if (test_skip) {
    unsigned int sse16x16[64] = { 0 };
    int sum16x16[64] = { 0 };
    unsigned int var16x16[64] = { 0 };
    const unsigned int *sse_tx = sse8x8;
    const unsigned int *var_tx = var8x8;
    unsigned int num_blks = 1 << (bw + bh - 2);

    if (tx_size >= TX_16X16) {
      calculate_variance(bw, bh, TX_8X8, sse8x8, sum8x8, var16x16, sse16x16,
                         sum16x16);
      sse_tx = sse16x16;
      var_tx = var16x16;
      num_blks = num_blks >> 2;
    }
    set_early_term_based_on_uv_plane(cpi, x, bsize, xd, mi_row, mi_col,
                                     early_term, num_blks, sse_tx, var_tx, sum,
                                     var, sse);
  }
  calc_rate_dist_block_param(cpi, x, rd_stats, calculate_rd, early_term, bsize,
                             sse);
}